

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_hist.c
# Opt level: O3

int WebRtcIsac_DecHistBisectMulti
              (int *data,Bitstr *streamdata,uint16_t **cdf,uint16_t *cdf_size,int N)

{
  uint8_t *puVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  uint uVar5;
  ushort *puVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  
  uVar5 = streamdata->W_upper;
  if (uVar5 == 0) {
    return -2;
  }
  puVar4 = streamdata->stream + streamdata->stream_index;
  if (streamdata->stream_index == 0) {
    uVar10 = *(uint *)puVar4;
    puVar4 = puVar4 + 3;
    uVar9 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  else {
    uVar9 = streamdata->streamval;
  }
  if (0 < N) {
    uVar10 = 0;
    do {
      uVar13 = uVar5 & 0xffff;
      uVar11 = uVar5 >> 0x10;
      uVar2 = *cdf_size;
      puVar6 = (ushort *)((long)*cdf + ((ulong)(uVar2 & 0xfffffffe) - 2));
      uVar7 = (*puVar6 * uVar13 >> 0x10) + uVar11 * *puVar6;
      if (3 < uVar2) {
        uVar12 = (uint)(uVar2 >> 1);
        do {
          uVar8 = (ulong)(uVar12 >> 1);
          if (uVar9 <= uVar7) {
            uVar8 = -uVar8;
            uVar5 = uVar7;
            uVar7 = uVar10;
          }
          uVar10 = uVar7;
          puVar6 = puVar6 + uVar8;
          uVar7 = (*puVar6 * uVar13 >> 0x10) + uVar11 * *puVar6;
          bVar14 = 3 < uVar12;
          uVar12 = uVar12 >> 1;
        } while (bVar14);
      }
      uVar11 = uVar7;
      if (uVar9 <= uVar7) {
        uVar5 = uVar7;
        uVar11 = uVar10;
      }
      *data = (int)((ulong)((long)puVar6 - (long)*cdf) >> 1) - (uint)(uVar9 <= uVar7);
      uVar10 = uVar11 + 1;
      uVar7 = uVar5 - uVar10;
      uVar9 = uVar9 - uVar10;
      uVar5 = uVar7;
      if (uVar7 < 0x1000000) {
        do {
          puVar1 = puVar4 + 1;
          puVar4 = puVar4 + 1;
          uVar9 = uVar9 << 8 | (uint)*puVar1;
          uVar5 = uVar7 << 8;
          bVar14 = uVar7 < 0x10000;
          uVar7 = uVar5;
        } while (bVar14);
      }
      cdf_size = cdf_size + 1;
      data = data + 1;
      cdf = cdf + 1;
      bVar14 = 1 < N;
      N = N + -1;
    } while (bVar14);
  }
  uVar3 = (int)puVar4 - (int)streamdata;
  streamdata->stream_index = uVar3;
  streamdata->W_upper = uVar5;
  streamdata->streamval = uVar9;
  if (uVar5 < 0x2000000) {
    return uVar3 - 1;
  }
  return uVar3 - 2;
}

Assistant:

int WebRtcIsac_DecHistBisectMulti(int *data,     /* output: data vector */
                                  Bitstr *streamdata,   /* in-/output struct containing bitstream */
                                  const uint16_t **cdf,  /* input: array of cdf arrays */
                                  const uint16_t *cdf_size, /* input: array of cdf table sizes+1 (power of two: 2^k) */
                                  const int N)    /* input: data vector length */
{
  uint32_t    W_lower, W_upper;
  uint32_t    W_tmp;
  uint32_t    W_upper_LSB, W_upper_MSB;
  uint32_t    streamval;
  const   uint8_t *stream_ptr;
  const   uint16_t *cdf_ptr;
  int     size_tmp;
  int     k;

  W_lower = 0; //to remove warning -DH
  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;
  if (W_upper == 0)
    /* Should not be possible in normal operation */
    return -2;

  if (streamdata->stream_index == 0)   /* first time decoder is called for this stream */
  {
    /* read first word from bytestream */
    streamval = *stream_ptr << 24;
    streamval |= *++stream_ptr << 16;
    streamval |= *++stream_ptr << 8;
    streamval |= *++stream_ptr;
  } else {
    streamval = streamdata->streamval;
  }

  for (k=N; k>0; k--)
  {
    /* find the integer *data for which streamval lies in [W_lower+1, W_upper] */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;

    /* start halfway the cdf range */
    size_tmp = *cdf_size++ >> 1;
    cdf_ptr = *cdf + (size_tmp - 1);

    /* method of bisection */
    for ( ;; )
    {
      W_tmp = W_upper_MSB * *cdf_ptr;
      W_tmp += (W_upper_LSB * *cdf_ptr) >> 16;
      size_tmp >>= 1;
      if (size_tmp == 0) break;
      if (streamval > W_tmp)
      {
        W_lower = W_tmp;
        cdf_ptr += size_tmp;
      } else {
        W_upper = W_tmp;
        cdf_ptr -= size_tmp;
      }
    }
    if (streamval > W_tmp)
    {
      W_lower = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++);
    } else {
      W_upper = W_tmp;
      *data++ = (int)(cdf_ptr - *cdf++ - 1);
    }

    /* shift interval to start at zero */
    W_upper -= ++W_lower;

    /* add integer to bitstream */
    streamval -= W_lower;

    /* renormalize interval and update streamval */
    while ( !(W_upper & 0xFF000000) )    /* W_upper < 2^24 */
    {
      /* read next byte from stream */
      streamval = (streamval << 8) | *++stream_ptr;
      W_upper <<= 8;
    }

    if (W_upper == 0)
      /* Should not be possible in normal operation */
      return -2;


  }

  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;
  streamdata->streamval = streamval;


  /* find number of bytes in original stream (determined by current interval width) */
  if ( W_upper > 0x01FFFFFF )
    return streamdata->stream_index - 2;
  else
    return streamdata->stream_index - 1;
}